

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::LikeOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  bool *pbVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  char *pdata;
  char **ppcVar9;
  ulong uVar10;
  char *pcVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  char **local_98;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  ulong local_68;
  bool *local_60;
  ulong local_58;
  bool *local_50;
  ulong local_48;
  ValidityMask *local_40;
  string_t *local_38;
  
  local_60 = result_data;
  local_58 = count;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar7 = *(ulong *)&ldata->value;
      pcVar11 = (ldata->value).pointer.ptr;
      pcVar8 = (char *)((long)&local_78 + 4);
      if (0xc < (uint)uVar7) {
        pcVar8 = pcVar11;
      }
      local_98 = &(rdata->value).pointer.ptr;
      iVar12 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_98 + -1);
        local_88._0_4_ = paVar1->length;
        local_88._4_1_ = paVar1->prefix[0];
        local_88._5_1_ = paVar1->prefix[1];
        local_88._6_1_ = paVar1->prefix[2];
        local_88._7_1_ = paVar1->prefix[3];
        local_80 = *local_98;
        pdata = local_80;
        if ((uint)(undefined4)local_88 < 0xd) {
          pdata = (char *)((long)&local_88 + 4);
        }
        local_78 = uVar7;
        local_70 = pcVar11;
        bVar6 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                          (pcVar8,uVar7 & 0xffffffff,pdata,local_88 & 0xffffffff,'\0');
        local_60[iVar12] = bVar6;
        iVar12 = iVar12 + 1;
        local_98 = local_98 + 2;
      } while (local_58 != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = count + 0x3f >> 6;
    uVar10 = 0;
    local_68 = 0;
    local_48 = uVar7;
    local_40 = mask;
    local_38 = ldata;
    do {
      pbVar4 = local_60;
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = uVar10 + 0x40;
        if (local_58 <= uVar10 + 0x40) {
          uVar13 = local_58;
        }
LAB_00a0520d:
        uVar5 = uVar10;
        if (uVar10 < uVar13) {
          uVar3 = *(ulong *)&ldata->value;
          local_50 = (bool *)(ldata->value).pointer.ptr;
          pcVar11 = local_50;
          if ((uint)uVar3 < 0xd) {
            pcVar11 = (char *)((long)&local_78 + 4);
          }
          ppcVar9 = &rdata[uVar10].value.pointer.ptr;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
            local_88._0_4_ = paVar1->length;
            local_88._4_1_ = paVar1->prefix[0];
            local_88._5_1_ = paVar1->prefix[1];
            local_88._6_1_ = paVar1->prefix[2];
            local_88._7_1_ = paVar1->prefix[3];
            local_80 = *ppcVar9;
            local_70 = local_50;
            pcVar8 = local_80;
            if ((uint)(undefined4)local_88 < 0xd) {
              pcVar8 = (char *)((long)&local_88 + 4);
            }
            local_78 = uVar3;
            bVar6 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                              (pcVar11,uVar3 & 0xffffffff,pcVar8,local_88 & 0xffffffff,'\0');
            pbVar4[uVar10] = bVar6;
            uVar10 = uVar10 + 1;
            ppcVar9 = ppcVar9 + 2;
            uVar7 = local_48;
            uVar5 = uVar13;
            mask = local_40;
            ldata = local_38;
          } while (uVar13 != uVar10);
        }
      }
      else {
        uVar3 = puVar2[local_68];
        uVar13 = uVar10 + 0x40;
        if (local_58 <= uVar10 + 0x40) {
          uVar13 = local_58;
        }
        uVar5 = uVar13;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_00a0520d;
          uVar5 = uVar10;
          if (uVar10 < uVar13) {
            local_50 = local_60 + uVar10;
            ppcVar9 = &rdata[uVar10].value.pointer.ptr;
            uVar14 = 0;
            do {
              if ((uVar3 >> (uVar14 & 0x3f) & 1) != 0) {
                local_78 = *(ulong *)&ldata->value;
                local_70 = (ldata->value).pointer.ptr;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
                local_88._0_4_ = paVar1->length;
                local_88._4_1_ = paVar1->prefix[0];
                local_88._5_1_ = paVar1->prefix[1];
                local_88._6_1_ = paVar1->prefix[2];
                local_88._7_1_ = paVar1->prefix[3];
                local_80 = *ppcVar9;
                pcVar11 = local_70;
                if ((uint)local_78 < 0xd) {
                  pcVar11 = (char *)((long)&local_78 + 4);
                }
                pcVar8 = local_80;
                if ((uint)(undefined4)local_88 < 0xd) {
                  pcVar8 = (char *)((long)&local_88 + 4);
                }
                bVar6 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                  (pcVar11,local_78 & 0xffffffff,pcVar8,local_88 & 0xffffffff,'\0');
                local_50[uVar14] = bVar6;
              }
              uVar14 = uVar14 + 1;
              ppcVar9 = ppcVar9 + 2;
              uVar7 = local_48;
              uVar5 = uVar13;
            } while (uVar13 - uVar10 != uVar14);
          }
        }
      }
      uVar10 = uVar5;
      local_68 = local_68 + 1;
    } while (local_68 != uVar7);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}